

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void xchg_edx(PDISASM pMyDisasm)

{
  PDISASM pMyDisasm_local;
  
  (pMyDisasm->Instruction).Category = 0x10001;
  strcpy((pMyDisasm->Instruction).Mnemonic,"xchg");
  (pMyDisasm->Operand1).OpType = 0x20000;
  (pMyDisasm->Operand1).Registers.type = 1;
  (pMyDisasm->Operand1).Registers.gpr = 1;
  (pMyDisasm->Operand2).OpType = 0x20000;
  (pMyDisasm->Operand2).Registers.type = 1;
  (pMyDisasm->Operand2).Registers.gpr = 4;
  if ((pMyDisasm->Reserved_).OperandSize == 0x40) {
    strcpy((pMyDisasm->Operand1).OpMnemonic,Registers64Bits[0]);
    if ((pMyDisasm->Reserved_).REX.B_ == '\x01') {
      strcpy((pMyDisasm->Operand2).OpMnemonic,Registers64Bits[10]);
    }
    else {
      strcpy((pMyDisasm->Operand2).OpMnemonic,Registers64Bits[2]);
    }
    (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
    (pMyDisasm->Operand2).AccessMode = 2;
    (pMyDisasm->Operand1).OpSize = 0x40;
    (pMyDisasm->Operand2).OpSize = 0x40;
  }
  else if ((pMyDisasm->Reserved_).OperandSize == 0x20) {
    strcpy((pMyDisasm->Operand1).OpMnemonic,Registers32Bits[0]);
    if ((pMyDisasm->Reserved_).REX.B_ == '\x01') {
      strcpy((pMyDisasm->Operand2).OpMnemonic,Registers32Bits[10]);
    }
    else {
      strcpy((pMyDisasm->Operand2).OpMnemonic,Registers32Bits[2]);
    }
    (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
    (pMyDisasm->Operand2).AccessMode = 2;
    (pMyDisasm->Operand1).OpSize = 0x20;
    (pMyDisasm->Operand2).OpSize = 0x20;
  }
  else {
    strcpy((pMyDisasm->Operand1).OpMnemonic,Registers16Bits[0]);
    if ((pMyDisasm->Reserved_).REX.B_ == '\x01') {
      strcpy((pMyDisasm->Operand2).OpMnemonic,Registers16Bits[10]);
    }
    else {
      strcpy((pMyDisasm->Operand2).OpMnemonic,Registers16Bits[2]);
    }
    (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
    (pMyDisasm->Operand2).AccessMode = 2;
    (pMyDisasm->Operand1).OpSize = 0x10;
    (pMyDisasm->Operand2).OpSize = 0x10;
  }
  return;
}

Assistant:

void __bea_callspec__ xchg_edx(PDISASM pMyDisasm)
{
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+DATA_TRANSFER;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "xchg");
    #endif
    pMyDisasm->Operand1.OpType = REGISTER_TYPE;
  pMyDisasm->Operand1.Registers.type = GENERAL_REG;
  pMyDisasm->Operand1.Registers.gpr = REG0;
    pMyDisasm->Operand2.OpType = REGISTER_TYPE;
  pMyDisasm->Operand2.Registers.type = GENERAL_REG;
  pMyDisasm->Operand2.Registers.gpr = REG2;
    if (GV.OperandSize == 64) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Operand1.OpMnemonic, Registers64Bits[0]);
        #endif
        if (GV.REX.B_ == 1) {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand2.OpMnemonic, Registers64Bits[2+8]);
            #endif
        }
        else {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand2.OpMnemonic, Registers64Bits[2]);
            #endif
        }
        GV.EIP_++;
        pMyDisasm->Operand2.AccessMode = WRITE;
        pMyDisasm->Operand1.OpSize = 64;
        pMyDisasm->Operand2.OpSize = 64;
    }
    else if (GV.OperandSize == 32) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Operand1.OpMnemonic, Registers32Bits[0]);
        #endif
        if (GV.REX.B_ == 1) {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand2.OpMnemonic, Registers32Bits[2+8]);
            #endif
        }
        else {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand2.OpMnemonic, Registers32Bits[2]);
            #endif
        }
        GV.EIP_++;
        pMyDisasm->Operand2.AccessMode = WRITE;
        pMyDisasm->Operand1.OpSize = 32;
        pMyDisasm->Operand2.OpSize = 32;
    }
    else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Operand1.OpMnemonic, Registers16Bits[0]);
        #endif
        if (GV.REX.B_ == 1) {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand2.OpMnemonic, Registers16Bits[2+8]);
            #endif
        }
        else {
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Operand2.OpMnemonic, Registers16Bits[2]);
            #endif
        }
        GV.EIP_++;
        pMyDisasm->Operand2.AccessMode = WRITE;
        pMyDisasm->Operand1.OpSize = 16;
        pMyDisasm->Operand2.OpSize = 16;
    }
}